

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_iter.cpp
# Opt level: O1

int R6PIter(MatrixXd *X,MatrixXd *u,Vector3d *vk,double r0,RSDoublelinCameraPoseVector *results)

{
  double dVar1;
  double dVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  Vector3d *pVVar16;
  double *pdVar17;
  undefined8 *puVar18;
  double *pdVar19;
  Index row;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  long lVar23;
  Index row_17;
  ulong uVar24;
  Index row_7;
  Index row_6;
  long lVar25;
  Index row_1;
  long lVar26;
  DstEvaluatorType dstEvaluator;
  MatrixXd n;
  SrcEvaluatorType srcEvaluator;
  Matrix<double,_12,_13,_0,_12,_13> A;
  assign_op<double,_double> local_bd1;
  Vector3d *local_bd0;
  MatrixXd *local_bc8;
  RSDoublelinCameraPoseVector *local_bc0;
  DstEvaluatorType local_bb8;
  DstXprType local_ba8;
  generic_dense_assignment_kernel<_c64cef4d_> local_b18;
  undefined1 local_af8 [40];
  double *local_ad0;
  undefined1 local_ac8 [16];
  double local_ab8;
  undefined1 local_ab0 [16];
  double *local_aa0;
  double local_a98;
  double dStack_a90;
  double *local_a80;
  double local_a78;
  double *local_a60;
  double local_a58;
  double *local_a40;
  double local_a38;
  double *local_a10;
  double local_a08;
  double *local_9f0;
  double local_9e8;
  double *local_9c8;
  double local_9c0;
  double local_9b0;
  double *local_998;
  double local_990;
  double *local_970;
  double local_968;
  double local_958;
  double *local_940;
  double local_938;
  double *local_918;
  double local_910;
  double local_900;
  double *local_8e8;
  double local_8e0;
  undefined8 auStack_568 [9];
  undefined2 local_51f;
  Matrix<double,_12,_13,_0,_12,_13> local_518;
  
  local_ac8._8_8_ = local_ac8._0_8_;
  local_bd0 = vk;
  local_bc0 = results;
  memset(&local_518,0,0x4e0);
  pVVar16 = local_bd0;
  local_ad0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a78 = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_a80 = local_ad0 + 2;
  local_aa0 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a98 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_a40 = local_aa0 + 1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    lVar20 = 0;
    pdVar17 = local_a80;
    pdVar19 = local_a40;
    do {
      local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
      array[lVar20] = pdVar17[-1] * *pdVar19 + *pdVar17;
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + (long)local_a98;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar20);
  }
  local_a10 = local_ad0 + 1;
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    lVar20 = 0;
    pdVar17 = local_aa0;
    pdVar19 = local_a10;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar20 * 8 + 0x30) = -*pdVar19 * *pdVar17;
      lVar20 = lVar20 + 1;
      pdVar17 = pdVar17 + (long)local_a98;
      pdVar19 = pdVar19 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar20);
  }
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    lVar20 = 0;
    pdVar17 = local_a40;
    pdVar19 = local_ad0;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar20 * 8 + 0x60) = -*pdVar19 * *pdVar17;
      lVar20 = lVar20 + 1;
      pdVar17 = pdVar17 + (long)local_a98;
      pdVar19 = pdVar19 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar20);
  }
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    lVar20 = 0;
    pdVar17 = local_aa0;
    pdVar19 = local_a80;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar20 * 8 + 0x90) = pdVar19[-2] * *pdVar17 + *pdVar19;
      lVar20 = lVar20 + 1;
      pdVar17 = pdVar17 + (long)local_a98;
      pdVar19 = pdVar19 + (long)local_a78;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar20);
  }
  lVar20 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar20) {
    lVar26 = 0;
    pdVar17 = local_ad0;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar26 * 8 + 0xc0) = -*pdVar17;
      lVar26 = lVar26 + 1;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (lVar20 != lVar26);
  }
  if (0 < lVar20) {
    lVar26 = 0;
    pdVar17 = local_a10;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar26 * 8 + 0xf0) = -*pdVar17;
      lVar26 = lVar26 + 1;
      pdVar17 = pdVar17 + (long)local_a78;
    } while (lVar20 != lVar26);
  }
  local_bb8.
  super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
  .m_data = (PointerType)
            ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                   m_storage.m_data.array + 0x120);
  local_958 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
  local_ab8 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
  local_9b0 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = 1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = 6;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_xpr =
       &local_518;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startCol.
  m_value = 3;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_outerStride =
       0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = 0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startRow.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startCol.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_outerStride = 0xc;
  local_b18.m_dst = &local_bb8;
  local_b18.m_functor = &local_bd1;
  local_bc8 = X;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_0>.m_data =
       local_bb8.
       super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
       .
       super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
       .m_data;
  local_b18.m_src = (SrcEvaluatorType *)local_af8;
  local_b18.m_dstExpr = &local_ba8;
  local_a60 = local_aa0;
  local_a58 = local_a98;
  local_a38 = local_a98;
  local_a08 = local_a78;
  local_9f0 = local_aa0;
  local_9e8 = local_a98;
  local_9c8 = local_ad0;
  local_9c0 = local_a78;
  local_998 = local_aa0;
  local_990 = local_a98;
  local_970 = local_a80;
  local_968 = local_a78;
  local_940 = local_aa0;
  local_938 = local_a98;
  local_918 = local_a10;
  local_910 = local_a78;
  local_900 = local_958;
  local_8e8 = local_aa0;
  local_8e0 = local_a98;
  local_ac8._0_8_ = local_a78;
  Eigen::internal::dense_assignment_loop<$a3657759$>::run
            ((generic_dense_assignment_kernel<_1fd48d7f_> *)&local_b18);
  local_aa0 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a98 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_ad0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_a78 = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows;
  local_900 = (pVVar16->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
  local_9b0 = (pVVar16->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[2];
  local_a80 = local_ad0 + 2;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    lVar20 = 0;
    pdVar17 = local_aa0;
    pdVar19 = local_a80;
    do {
      dVar1 = *pdVar17;
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar20 * 8 + 0x150) =
           (*pdVar19 * local_900 * dVar1 + (-dVar1 * local_9b0 * pdVar19[-2] - dVar1 * pdVar19[-1]))
           * dVar1;
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + (long)local_a78;
      pdVar17 = pdVar17 + (long)local_a98;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar20);
  }
  local_9c8 = local_ad0 + 1;
  local_ab8 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
  if (0 < local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_rows.m_value) {
    pdVar17 = local_aa0 + 1;
    lVar20 = 0;
    pdVar19 = local_9c8;
    do {
      dVar1 = pdVar17[-1];
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar20 * 8 + 0x180) =
           ((dVar1 * *pdVar19 * local_9b0 - pdVar19[-1] * dVar1) - dVar1 * pdVar19[1] * local_ab8) *
           *pdVar17;
      lVar20 = lVar20 + 1;
      pdVar19 = pdVar19 + (long)local_a78;
      pdVar17 = pdVar17 + (long)local_a98;
    } while (local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
             .m_rows.m_value != lVar20);
  }
  local_bb8.
  super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
  .m_data = (PointerType)
            ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                   m_storage.m_data.array + 0x1b0);
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = 1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = 6;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_0>.m_data =
       (PointerType)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + 0x180);
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_xpr =
       &local_518;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startCol.
  m_value = 4;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_outerStride =
       0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = 6;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = 0xc;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startRow.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_startCol.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_outerStride = 0xc;
  local_ac8._0_8_ = local_a78;
  local_b18.m_dst = &local_bb8;
  local_b18.m_functor = &local_bd1;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .m_xpr.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_data = local_bb8.
            super_block_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
            .
            super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,_12,_1>_>
            .m_data;
  local_b18.m_src = (SrcEvaluatorType *)local_af8;
  local_b18.m_dstExpr = &local_ba8;
  local_a60 = local_aa0;
  local_a58 = local_a98;
  local_a40 = local_aa0;
  local_a38 = local_a98;
  local_a10 = local_ad0;
  local_a08 = local_a78;
  local_9f0 = local_aa0;
  local_9e8 = local_a98;
  local_9c0 = local_a78;
  local_998 = local_aa0;
  local_990 = local_a98;
  local_970 = local_a80;
  local_968 = local_a78;
  local_958 = local_ab8;
  local_940 = local_aa0;
  local_938 = local_a98;
  local_918 = local_9c8;
  local_910 = local_a78;
  local_8e8 = local_aa0;
  local_8e0 = local_a98;
  Eigen::internal::dense_assignment_loop<$2f2011cb$>::run(&local_b18);
  pdVar17 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar20 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  pdVar19 = (local_bc8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
            m_data;
  lVar26 = (local_bc8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_rows;
  dVar1 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[1];
  dVar8 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data
          .array[2];
  lVar3 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar3) {
    pdVar22 = pdVar19 + 1;
    lVar25 = 0;
    pdVar21 = pdVar17;
    do {
      dVar2 = *pdVar21;
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x1e0) =
           (dVar2 * *pdVar22 * dVar8 - pdVar22[-1] * dVar2) - dVar2 * pdVar22[1] * dVar1;
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
      pdVar22 = pdVar22 + lVar26;
    } while (lVar3 != lVar25);
  }
  pdVar19 = pdVar19 + 2;
  if (0 < lVar3) {
    dVar1 = (local_bd0->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[0];
    lVar25 = 0;
    pdVar22 = pdVar17;
    pdVar21 = pdVar19;
    do {
      dVar2 = *pdVar22;
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x210) =
           *pdVar21 * dVar1 * dVar2 + (-dVar2 * dVar8 * pdVar21[-2] - dVar2 * pdVar21[-1]);
      lVar25 = lVar25 + 1;
      pdVar22 = pdVar22 + lVar20;
      pdVar21 = pdVar21 + lVar26;
    } while (lVar3 != lVar25);
  }
  uVar24 = 0xfffffffffffffffe;
  do {
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar24 * 8 + 0x280) = 0x3ff0000000000000;
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar24 * 8 + 0x288) = 0x3ff0000000000000;
    uVar24 = uVar24 + 2;
  } while (uVar24 < 4);
  uVar24 = 0xfffffffffffffffe;
  do {
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar24 * 8 + 0x2b0) = 0xbff0000000000000;
    *(undefined8 *)
     ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
            m_data.array + uVar24 * 8 + 0x2b8) = 0xbff0000000000000;
    uVar24 = uVar24 + 2;
  } while (uVar24 < 4);
  pdVar22 = pdVar17 + 1;
  if (0 < lVar3) {
    lVar25 = 0;
    pdVar21 = pdVar22;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x300) = *pdVar21;
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
    } while (lVar3 != lVar25);
  }
  if (0 < lVar3) {
    lVar25 = 0;
    pdVar21 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x330) = -*pdVar21;
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
    } while (lVar3 != lVar25);
  }
  if (0 < lVar3) {
    lVar25 = 0;
    pdVar21 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x390) = *pdVar21;
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
    } while (lVar3 != lVar25);
  }
  if (0 < lVar3) {
    lVar25 = 0;
    pdVar21 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x3c0) = -*pdVar21;
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
    } while (lVar3 != lVar25);
  }
  if (0 < lVar3) {
    lVar25 = 0;
    pdVar21 = pdVar22;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x420) = *pdVar21 * pdVar21[-1];
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
    } while (lVar3 != lVar25);
  }
  if (0 < lVar3) {
    lVar25 = 0;
    pdVar21 = pdVar17;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x450) = -*pdVar21 * *pdVar21;
      lVar25 = lVar25 + 1;
      pdVar21 = pdVar21 + lVar20;
    } while (lVar3 != lVar25);
  }
  lVar25 = (local_bc8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
           m_cols;
  if (0 < lVar25) {
    lVar23 = 0;
    pdVar21 = pdVar19;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar23 * 8 + 0x480) = *pdVar21 * *pdVar22 - pdVar21[-1];
      lVar23 = lVar23 + 1;
      pdVar22 = pdVar22 + lVar20;
      pdVar21 = pdVar21 + lVar26;
    } while (lVar25 != lVar23);
  }
  if (0 < lVar3) {
    lVar25 = 0;
    do {
      *(double *)
       ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
              m_data.array + lVar25 * 8 + 0x4b0) = pdVar19[-2] - *pdVar19 * *pdVar17;
      lVar25 = lVar25 + 1;
      pdVar17 = pdVar17 + lVar20;
      pdVar19 = pdVar19 + lVar26;
    } while (lVar3 != lVar25);
  }
  local_51f._0_1_ = false;
  local_51f._1_1_ = false;
  lVar20 = 0x50;
  do {
    uVar9 = *(undefined8 *)((long)auStack_568 + lVar20 + 8);
    uVar10 = *(undefined8 *)((long)auStack_568 + lVar20 + 0x10);
    uVar11 = *(undefined8 *)((long)auStack_568 + lVar20 + 0x18);
    uVar12 = *(undefined8 *)((long)auStack_568 + lVar20 + 0x20);
    uVar13 = *(undefined8 *)((long)auStack_568 + lVar20 + 0x28);
    uVar14 = *(undefined8 *)((long)auStack_568 + lVar20 + 0x30);
    uVar15 = *(undefined8 *)((long)auStack_568 + lVar20 + 0x38);
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
     + lVar20 + 0x48) = *(undefined8 *)((long)auStack_568 + lVar20);
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
     + lVar20 + 0x50) = uVar9;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_xpr.
             super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
     + lVar20 + 0x58) = uVar10;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_startRow.m_value + lVar20) = uVar11;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_startCol.m_value + lVar20) = uVar12;
    *(undefined8 *)
     ((long)&local_ba8.
             super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
             .
             super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
             .m_outerStride + lVar20) = uVar13;
    *(undefined8 *)((long)&local_b18.m_dst + lVar20) = uVar14;
    *(undefined8 *)(local_af8 + lVar20 + -0x18) = uVar15;
    uVar9 = *(undefined8 *)(&stack0xfffffffffffffae0 + lVar20);
    *(undefined8 *)(local_af8 + lVar20 + -0x10) = *(undefined8 *)((long)auStack_568 + lVar20 + 0x40)
    ;
    *(undefined8 *)(local_af8 + lVar20 + -8) = uVar9;
    uVar9 = *(undefined8 *)
             ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                    m_storage.m_data.array + lVar20 + 8);
    *(undefined8 *)(local_af8 + lVar20) =
         *(undefined8 *)
          ((long)local_518.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                 m_storage.m_data.array + lVar20);
    *(undefined8 *)(local_af8 + lVar20 + 8) = uVar9;
    lVar20 = lVar20 + 0x60;
  } while (lVar20 != 0x530);
  Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>::computeInPlace
            ((FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_> *)local_af8);
  Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_>
  ::kernel_retval_base
            ((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_> *)
             &local_b18,(FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_> *)local_af8);
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_data = (PointerType)0x0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_rows.m_value = 0;
  local_ba8.
  super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
  .m_cols.m_value = 0;
  if ((local_b18.m_functor != (assign_op<double,_double> *)0x0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)local_b18.m_functor)
             ,0) < 0xd)) {
    puVar18 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar18 = operator_new;
    __cxa_throw(puVar18,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&local_ba8,(long)local_b18.m_functor * 0xd,0xd,
             (Index)local_b18.m_functor);
  Eigen::internal::kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>>::
  evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((kernel_retval<Eigen::FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>> *)&local_b18,
             (Matrix<double,__1,__1,_0,__1,__1> *)&local_ba8);
  lVar20 = ((int)local_ba8.
                 super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
                 .
                 super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
                 .m_cols.m_value + -1) *
           local_ba8.
           super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
           .
           super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
           .
           super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
           .m_rows.m_value;
  dVar1 = local_ba8.
          super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
          .
          super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
          .m_data[lVar20 + 0xc];
  local_af8._16_8_ =
       local_ba8.
       super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
       .m_data[lVar20 + 2] / dVar1;
  local_ab8 = local_ba8.
              super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
              .m_data[lVar20 + 5] / dVar1;
  local_ad0 = (double *)
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data[lVar20 + 8] / dVar1);
  local_aa0 = (double *)
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data[lVar20 + 0xb] / dVar1);
  auVar4._8_8_ = dVar1;
  auVar4._0_8_ = dVar1;
  local_af8._0_16_ =
       divpd(*(undefined1 (*) [16])
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data + lVar20),auVar4);
  auVar5._8_8_ = dVar1;
  auVar5._0_8_ = dVar1;
  local_ac8 = divpd(*(undefined1 (*) [16])
                     (local_ba8.
                      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
                      .m_data + lVar20 + 3),auVar5);
  auVar6._8_8_ = dVar1;
  auVar6._0_8_ = dVar1;
  local_af8._24_16_ =
       divpd(*(undefined1 (*) [16])
              (local_ba8.
               super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
               .
               super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
               .m_data + lVar20 + 6),auVar6);
  auVar7._8_8_ = dVar1;
  auVar7._0_8_ = dVar1;
  local_ab0 = divpd(*(undefined1 (*) [16])
                     (local_ba8.
                      super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
                      .
                      super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
                      .
                      super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
                      .m_data + lVar20 + 9),auVar7);
  local_a98 = 1.0;
  dStack_a90 = 0.0;
  std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
  emplace_back<RSDoublelinCameraPose>(local_bc0,(RSDoublelinCameraPose *)local_af8);
  free(local_ba8.
       super_BlockImpl<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,__1,__1,_false>,_0>
       .m_data);
  return 0;
}

Assistant:

int R6PIter(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, const Eigen::Vector3d & vk, double r0, RSDoublelinCameraPoseVector * results){
    Eigen::Matrix<double,12,13> A = Eigen::Matrix<double,12,13>::Zero();
    A.col(0).head(6) << X.row(2).transpose().array() + X.row(1).transpose().array() * u.row(1).transpose().array();  
    A.col(0).tail(6) << -X.row(1).transpose().array() * u.row(0).transpose().array();
    A.col(1).head(6) << -X.row(0).transpose().array() * u.row(1).transpose().array();
    A.col(1).tail(6) << X.row(2).transpose().array() + X.row(0).transpose().array() * u.row(0).transpose().array();
    A.col(2).head(6) << - X.row(0).transpose().array();
    A.col(2).tail(6) << - X.row(1).transpose().array();
    A.col(3).head(6) << X.row(0).transpose().array() * vk(1) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * (- u.row(0).transpose().array()) - u.row(1).transpose().array() * (X.row(1).transpose().array() * ( -u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array())) - X.row(1).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(3).tail(6) << u.row(0).transpose().array() * (X.row(1).transpose().array() * (-u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array()));
    A.col(4).head(6) << u.row(1).transpose().array() * (X.row(0).transpose().array() * (-u.row(0).transpose().array()) - X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array()));
    A.col(4).tail(6) << X.row(0).transpose().array() * vk(1) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * (-u.row(0).transpose().array()) - u.row(0).transpose().array() * (X.row(0).transpose().array() * (-u.row(0).transpose().array()) -X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array())) - X.row(1).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(5).head(6) << X.row(0).transpose().array() * (-u.row(0).transpose().array()) - X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array());
    A.col(5).tail(6) << X.row(1).transpose().array() * (-u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(6).tail(6) << Eigen::MatrixXd::Ones(6,1);
    A.col(7).head(6) << -Eigen::MatrixXd::Ones(6,1);
    A.col(8).head(6) << u.row(1).transpose().array();
    A.col(8).tail(6) << -u.row(0).transpose().array();
    A.col(9).tail(6) << u.row(0).transpose().array();
    A.col(10).head(6) << -u.row(0).transpose().array();
    A.col(11).head(6) << -u.row(1).transpose().array() * (-u.row(0).transpose().array());
    A.col(11).tail(6) << u.row(0).transpose().array() * (-u.row(0).transpose().array());
    A.col(12).head(6) << X.row(2).transpose().array() * u.row(1).transpose().array() - X.row(1).transpose().array();
    A.col(12).tail(6) << X.row(0).transpose().array() - X.row(2).transpose().array() * u.row(0).transpose().array();
    Eigen::MatrixXd n = A.fullPivLu().kernel();
    // std::cout << "A inverse done \n";
    int end = n.cols()-1;
    double s = n(12,end);
    // std::cout << "scalar done \n";
    Eigen::Vector3d v = n.col(end).head(3)/s; 
    // std::cout << "v: \n" << v << "\n";
    Eigen::Vector3d w = n.col(end).segment(3,3)/s;
    // std::cout << "w done \n" << w << "\n";
    Eigen::Vector3d C = n.col(end).segment(6,3)/s;
    // std::cout << "C done \n" << C << "\n";
    Eigen::Vector3d t = n.col(end).segment(9,3)/s;
    // std::cout << "t done \n" << t << "\n";

    results->push_back({v, C, w, t, 1, 0});

    return 0;

}